

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O1

void ge_scalarmult_base(ge_p3 *h,uchar *a)

{
  long lVar1;
  char cVar2;
  char cVar4;
  uint uVar5;
  int iVar6;
  timeval *in_R8;
  ulong uVar7;
  char e [64];
  ge_precomp t;
  ge_p2 s;
  ge_p1p1 r;
  byte local_1f8 [64];
  ge_precomp local_1b8;
  ge_p2 local_140;
  ge_p1p1 local_c8;
  byte bVar3;
  fd_set *__exceptfds;
  
  lVar1 = 0;
  do {
    bVar3 = a[lVar1];
    local_1f8[lVar1 * 2] = bVar3 & 0xf;
    local_1f8[lVar1 * 2 + 1] = bVar3 >> 4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  lVar1 = 0;
  __exceptfds = (fd_set *)0x0;
  do {
    cVar4 = (char)__exceptfds + local_1f8[lVar1];
    iVar6 = (int)CONCAT71((int7)((ulong)__exceptfds >> 8),cVar4) + 8;
    bVar3 = (byte)iVar6;
    cVar2 = (char)bVar3 >> 4;
    __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((uint)iVar6 >> 8),cVar2);
    local_1f8[lVar1] = cVar4 - (bVar3 & 0xf0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f);
  local_1f8[0x3f] = local_1f8[0x3f] + cVar2;
  ge_p3_0(h);
  uVar7 = 0xffffffffffffffff;
  uVar5 = 0;
  do {
    select((int)(ge_precomp *)(local_1f8 + 0x40),(fd_set *)(ulong)uVar5,
           (fd_set *)(ulong)(uint)(int)(char)local_1f8[uVar7 + 2],__exceptfds,in_R8);
    ge_madd(&local_c8,h,(ge_precomp *)(local_1f8 + 0x40));
    ge_p1p1_to_p3(h,&local_c8);
    uVar7 = uVar7 + 2;
    uVar5 = uVar5 + 1;
  } while (uVar7 < 0x3e);
  ge_p3_to_p2(&local_140,h);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p3(h,&local_c8);
  uVar7 = 0xfffffffffffffffe;
  uVar5 = 0;
  do {
    select((int)(ge_precomp *)(local_1f8 + 0x40),(fd_set *)(ulong)uVar5,
           (fd_set *)(ulong)(uint)(int)(char)local_1f8[uVar7 + 2],__exceptfds,in_R8);
    ge_madd(&local_c8,h,(ge_precomp *)(local_1f8 + 0x40));
    ge_p1p1_to_p3(h,&local_c8);
    uVar7 = uVar7 + 2;
    uVar5 = uVar5 + 1;
  } while (uVar7 < 0x3e);
  return;
}

Assistant:

void ge_scalarmult_base(ge_p3 *h, const unsigned char *a) {
    signed char e[64];
    signed char carry;
    ge_p1p1 r;
    ge_p2 s;
    ge_precomp t;
    int i;

    for (i = 0; i < 32; ++i) {
        e[2 * i + 0] = (a[i] >> 0) & 15;
        e[2 * i + 1] = (a[i] >> 4) & 15;
    }

    /* each e[i] is between 0 and 15 */
    /* e[63] is between 0 and 7 */
    carry = 0;

    for (i = 0; i < 63; ++i) {
        e[i] += carry;
        carry = e[i] + 8;
        carry >>= 4;
        e[i] -= carry << 4;
    }

    e[63] += carry;
    /* each e[i] is between -8 and 8 */
    ge_p3_0(h);

    for (i = 1; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }

    ge_p3_dbl(&r, h);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p3(h, &r);

    for (i = 0; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }
}